

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O0

Expression *
wasm::Bits::makePackedFieldGet(Expression *value,Field *field,bool signed_,Module *wasm)

{
  bool bVar1;
  uint uVar2;
  int32_t x;
  Const *right;
  int32_t mask;
  Builder builder;
  Module *wasm_local;
  bool signed__local;
  Field *field_local;
  Expression *value_local;
  
  builder.wasm = wasm;
  bVar1 = Field::isPacked(field);
  value_local = value;
  if (bVar1) {
    if (signed_) {
      uVar2 = Field::getByteSize(field);
      value_local = makeSignExt(value,uVar2,builder.wasm);
    }
    else {
      Builder::Builder((Builder *)&stack0xffffffffffffffc8,builder.wasm);
      uVar2 = Field::getByteSize(field);
      x = lowBitMask(uVar2 << 3);
      right = Builder::makeConst<int>((Builder *)&stack0xffffffffffffffc8,x);
      value_local = (Expression *)
                    Builder::makeBinary((Builder *)&stack0xffffffffffffffc8,AndInt32,value,
                                        (Expression *)right);
    }
  }
  return value_local;
}

Assistant:

inline Expression* makePackedFieldGet(Expression* value,
                                      const Field& field,
                                      bool signed_,
                                      Module& wasm) {
  if (!field.isPacked()) {
    return value;
  }

  if (signed_) {
    return makeSignExt(value, field.getByteSize(), wasm);
  }

  Builder builder(wasm);
  auto mask = Bits::lowBitMask(field.getByteSize() * 8);
  return builder.makeBinary(AndInt32, value, builder.makeConst(int32_t(mask)));
}